

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

void __thiscall
amrex::FluxRegister::CrseAdd
          (FluxRegister *this,MultiFab *mflx,MultiFab *area,int dir,int srccomp,int destcomp,
          int numcomp,Real mult,Geometry *geom)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Periodicity PVar13;
  long local_338;
  long local_330;
  Box local_2ec;
  Array4<const_double> sfab;
  Array4<double> dfab;
  MFIter mfi;
  Array4<const_double> afab;
  MultiFab mf;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi.fabArray._4_4_ = 0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  MultiFab::MultiFab(&mf,&(mflx->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     &(mflx->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     numcomp,0,(MFInfo *)&mfi,
                     (mflx->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  MFIter::MFIter(&mfi,(FabArrayBase *)mflx,true);
  uVar2 = 0;
  if (0 < numcomp) {
    uVar2 = (ulong)(uint)numcomp;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_2ec,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&dfab,&mf.super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&sfab,&mflx->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&afab,&area->super_FabArray<amrex::FArrayBox>,&mfi);
    lVar10 = (long)local_2ec.smallend.vect[1];
    lVar9 = (long)local_2ec.smallend.vect[0] * 8;
    local_330 = 0;
    uVar4 = 0;
    local_338 = (long)srccomp << 3;
    while( true ) {
      lVar5 = (long)local_2ec.smallend.vect[2];
      if (uVar4 == uVar2) break;
      for (; (int)lVar5 <= local_2ec.bigend.vect[2]; lVar5 = lVar5 + 1) {
        lVar11 = (long)sfab.p +
                 sfab.nstride * local_338 +
                 (lVar10 - sfab.begin.y) * sfab.jstride * 8 +
                 (lVar5 - sfab.begin.z) * sfab.kstride * 8 + (long)sfab.begin.x * -8 + lVar9;
        lVar7 = (long)afab.p +
                (lVar10 - afab.begin.y) * afab.jstride * 8 +
                (lVar5 - afab.begin.z) * afab.kstride * 8 + (long)afab.begin.x * -8 + lVar9;
        lVar8 = (long)dfab.p +
                dfab.nstride * local_330 +
                (lVar10 - dfab.begin.y) * dfab.jstride * 8 +
                (lVar5 - dfab.begin.z) * dfab.kstride * 8 + (long)dfab.begin.x * -8 + lVar9;
        for (lVar3 = lVar10; lVar3 <= local_2ec.bigend.vect[1]; lVar3 = lVar3 + 1) {
          if (local_2ec.smallend.vect[0] <= local_2ec.bigend.vect[0]) {
            lVar12 = 0;
            do {
              *(double *)(lVar8 + lVar12 * 8) =
                   *(double *)(lVar11 + lVar12 * 8) * mult * *(double *)(lVar7 + lVar12 * 8);
              lVar12 = lVar12 + 1;
            } while ((local_2ec.bigend.vect[0] - local_2ec.smallend.vect[0]) + 1 != (int)lVar12);
          }
          lVar11 = lVar11 + sfab.jstride * 8;
          lVar7 = lVar7 + afab.jstride * 8;
          lVar8 = lVar8 + dfab.jstride * 8;
        }
      }
      uVar4 = uVar4 + 1;
      local_338 = local_338 + 8;
      local_330 = local_330 + 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  iVar6 = 2;
  while (iVar6 != 0) {
    iVar1 = dir + 3;
    if (iVar6 == 2) {
      iVar1 = dir;
    }
    PVar13 = Geometry::periodicity(geom);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
         (undefined1)PVar13.period.vect[0];
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
         PVar13.period.vect._1_7_;
    mfi.fabArray._0_4_ = PVar13.period.vect[2];
    FabSet::plusFrom((this->super_BndryRegister).bndry + iVar1,&mf,0,0,destcomp,numcomp,
                     (Periodicity *)&mfi);
    iVar6 = iVar6 + -1;
  }
  MultiFab::~MultiFab(&mf);
  return;
}

Assistant:

void
FluxRegister::CrseAdd (const MultiFab& mflx,
                       const MultiFab& area,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult,
                       const Geometry& geom)
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= mflx.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    const Orientation face_lo(dir,Orientation::low);
    const Orientation face_hi(dir,Orientation::high);

    MultiFab mf(mflx.boxArray(),mflx.DistributionMap(),numcomp,0,
                MFInfo(), mflx.Factory());

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mflx.isFusingCandidate()) {
        auto const& dma = mf.arrays();
        auto const& sma = mflx.const_arrays();
        auto const& ama = area.const_arrays();
        ParallelFor(mf, IntVect(0), numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dma[box_no](i,j,k,n) = sma[box_no](i,j,k,n+srccomp)*mult*ama[box_no](i,j,k);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mflx,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto       dfab =   mf.array(mfi);
            auto const sfab = mflx.const_array(mfi);
            auto const afab = area.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, numcomp, i, j, k, n,
            {
                dfab(i,j,k,n) = sfab(i,j,k,n+srccomp)*mult*afab(i,j,k);
            });
        }
    }

    for (int pass = 0; pass < 2; pass++)
    {
        const Orientation face = ((pass == 0) ? face_lo : face_hi);
        bndry[face].plusFrom(mf,0,0,destcomp,numcomp,geom.periodicity());
    }
}